

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O3

void Sfm_CreateFanout(Vec_Wec_t *vFanins,Vec_Wec_t *vFanouts)

{
  int *piVar1;
  int *piVar2;
  Vec_Int_t *pVVar3;
  ulong uVar4;
  void *pvVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  
  uVar7 = vFanins->nSize;
  iVar9 = vFanouts->nCap;
  if (iVar9 < (int)uVar7) {
    if (vFanouts->pArray == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)(int)uVar7 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(vFanouts->pArray,(long)(int)uVar7 << 4);
      iVar9 = vFanouts->nCap;
    }
    vFanouts->pArray = pVVar3;
    memset(pVVar3 + iVar9,0,(long)(int)(uVar7 - iVar9) << 4);
    vFanouts->nCap = uVar7;
  }
  vFanouts->nSize = uVar7;
  uVar4 = (ulong)vFanins->nSize;
  if (0 < (long)uVar4) {
    pVVar3 = vFanins->pArray;
    uVar6 = 0;
    do {
      if (0 < pVVar3[uVar6].nSize) {
        piVar2 = pVVar3[uVar6].pArray;
        lVar8 = 0;
        do {
          iVar9 = piVar2[lVar8];
          if (((long)iVar9 < 0) || ((int)uVar7 <= iVar9)) goto LAB_004c1f44;
          piVar1 = &vFanouts->pArray[iVar9].nSize;
          *piVar1 = *piVar1 + 1;
          lVar8 = lVar8 + 1;
        } while (lVar8 < pVVar3[uVar6].nSize);
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != uVar4);
  }
  if (0 < (int)uVar7) {
    lVar10 = 8;
    lVar8 = 0;
    do {
      pVVar3 = vFanouts->pArray;
      iVar9 = *(int *)((long)pVVar3 + lVar10 + -4);
      *(undefined4 *)((long)pVVar3 + lVar10 + -4) = 0;
      if (*(int *)((long)pVVar3 + lVar10 + -8) < iVar9) {
        pvVar5 = *(void **)((long)&pVVar3->nCap + lVar10);
        if (pvVar5 == (void *)0x0) {
          pvVar5 = malloc((long)iVar9 << 2);
        }
        else {
          pvVar5 = realloc(pvVar5,(long)iVar9 << 2);
        }
        *(void **)((long)&pVVar3->nCap + lVar10) = pvVar5;
        if (pvVar5 == (void *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        *(int *)((long)pVVar3 + lVar10 + -8) = iVar9;
        uVar7 = vFanouts->nSize;
      }
      lVar8 = lVar8 + 1;
      lVar10 = lVar10 + 0x10;
    } while (lVar8 < (int)uVar7);
    uVar4 = (ulong)(uint)vFanins->nSize;
  }
  if (0 < (int)uVar4) {
    lVar8 = 0;
    do {
      pVVar3 = vFanins->pArray;
      if (0 < pVVar3[lVar8].nSize) {
        lVar10 = 0;
        do {
          iVar9 = pVVar3[lVar8].pArray[lVar10];
          if (((long)iVar9 < 0) || (vFanouts->nSize <= iVar9)) {
LAB_004c1f44:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                          ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
          }
          Vec_IntPush(vFanouts->pArray + iVar9,(int)lVar8);
          lVar10 = lVar10 + 1;
        } while (lVar10 < pVVar3[lVar8].nSize);
        uVar4 = (ulong)(uint)vFanins->nSize;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (int)uVar4);
    uVar7 = vFanouts->nSize;
  }
  if (0 < (int)uVar7) {
    lVar8 = 0;
    do {
      if (*(int *)((long)&vFanouts->pArray->nSize + lVar8) !=
          *(int *)((long)&vFanouts->pArray->nCap + lVar8)) {
        __assert_fail("Vec_IntSize(vArray) == Vec_IntCap(vArray)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmNtk.c"
                      ,0x61,"void Sfm_CreateFanout(Vec_Wec_t *, Vec_Wec_t *)");
      }
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar8);
  }
  return;
}

Assistant:

void Sfm_CreateFanout( Vec_Wec_t * vFanins, Vec_Wec_t * vFanouts )
{
    Vec_Int_t * vArray;
    int i, k, Fanin;
    // count fanouts
    Vec_WecInit( vFanouts, Vec_WecSize(vFanins) );
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_WecEntry( vFanouts, Fanin )->nSize++;
    // allocate fanins
    Vec_WecForEachLevel( vFanouts, vArray, i )
    {
        k = vArray->nSize; vArray->nSize = 0;
        Vec_IntGrow( vArray, k );
    }
    // add fanouts
    Vec_WecForEachLevel( vFanins, vArray, i )
        Vec_IntForEachEntry( vArray, Fanin, k )
            Vec_IntPush( Vec_WecEntry( vFanouts, Fanin ), i );
    // verify
    Vec_WecForEachLevel( vFanouts, vArray, i )
        assert( Vec_IntSize(vArray) == Vec_IntCap(vArray) );
}